

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCatchExpr
          (ExprVisitorDelegate *this,TryExpr *expr,Catch *catch_)

{
  WatWriter *pWVar1;
  bool bVar2;
  char *pcVar3;
  Catch *catch__local;
  TryExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  Dedent(this->writer_);
  bVar2 = Catch::IsCatchAll(catch_);
  if (bVar2) {
    pWVar1 = this->writer_;
    pcVar3 = Opcode::GetName((Opcode *)&Opcode::CatchAll_Opcode);
    WritePutsNewline(pWVar1,pcVar3);
  }
  else {
    pWVar1 = this->writer_;
    pcVar3 = Opcode::GetName((Opcode *)&Opcode::Catch_Opcode);
    WritePutsSpace(pWVar1,pcVar3);
    WriteVar(this->writer_,&catch_->var,Newline);
  }
  Indent(this->writer_);
  ModuleContext::SetTopLabelType(&this->writer_->super_ModuleContext,Catch);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCatchExpr(TryExpr* expr,
                                                   Catch* catch_) {
  writer_->Dedent();
  if (catch_->IsCatchAll()) {
    writer_->WritePutsNewline(Opcode::CatchAll_Opcode.GetName());
  } else {
    writer_->WritePutsSpace(Opcode::Catch_Opcode.GetName());
    writer_->WriteVar(catch_->var, NextChar::Newline);
  }
  writer_->Indent();
  writer_->SetTopLabelType(LabelType::Catch);
  return Result::Ok;
}